

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::iterator_buffer<char_*,_char,_fmt::v7::detail::fixed_buffer_traits>::flush
          (iterator_buffer<char_*,_char,_fmt::v7::detail::fixed_buffer_traits> *this)

{
  size_t sVar1;
  char *pcVar2;
  iterator_buffer<char_*,_char,_fmt::v7::detail::fixed_buffer_traits> *this_local;
  
  sVar1 = buffer<char>::size(&this->super_buffer<char>);
  sVar1 = fixed_buffer_traits::limit(&this->super_fixed_buffer_traits,sVar1);
  pcVar2 = std::copy_n<char*,unsigned_long,char*>(this->data_,sVar1,this->out_);
  this->out_ = pcVar2;
  buffer<char>::clear(&this->super_buffer<char>);
  return;
}

Assistant:

void iterator_buffer<OutputIt, T, Traits>::flush() {
  out_ = std::copy_n(data_, this->limit(this->size()), out_);
  this->clear();
}